

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  uint uVar1;
  size_t code;
  ulong uVar2;
  size_t sVar3;
  long in_RDX;
  ulong uVar4;
  size_t in_RSI;
  undefined2 *in_RDI;
  long in_R8;
  code *in_R9;
  bool bVar5;
  size_t err_code_1;
  BIT_DStream_t bit;
  int i;
  BYTE *segmentEnd;
  size_t segmentSize;
  size_t err_code;
  size_t ret;
  HUF_DecompressFastArgs args;
  BYTE *oend;
  BYTE *iend;
  void *dt;
  BYTE *pStart;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t val_4;
  size_t val_3;
  size_t val_2;
  size_t val_1;
  size_t val;
  size_t val_5;
  size_t val_7;
  size_t val_8;
  size_t val_6;
  size_t val_9;
  size_t val_10;
  size_t val_11;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  HUF_DecompressFastArgs *in_stack_fffffffffffffb80;
  BIT_DStream_t *in_stack_fffffffffffffb88;
  uint local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  int local_44c;
  undefined2 *local_448;
  HUF_DTable *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  void *in_stack_fffffffffffffbd0;
  HUF_DecompressFastArgs *in_stack_fffffffffffffbd8;
  HUF_DecompressFastArgs *in_stack_fffffffffffffbe0;
  HUF_DecompressFastArgs *in_stack_fffffffffffffbe8;
  HUF_DecompressFastArgs *local_410;
  long alStack_408 [3];
  undefined2 *local_3f0;
  HUF_DecompressFastArgs *local_3c0;
  undefined2 *local_390;
  HUF_DecompressFastArgs *local_388;
  long local_380;
  code *local_378;
  size_t local_358;
  undefined2 *local_350;
  size_t local_348;
  undefined2 *local_340;
  U32 local_334;
  long local_330;
  undefined2 *local_328;
  BIT_DStream_t *local_320;
  undefined2 *local_318;
  BIT_DStream_status local_310;
  uint local_30c;
  BIT_DStream_t *local_308;
  BIT_DStream_status local_2fc;
  BIT_DStream_status local_2f8;
  uint local_2f4;
  BIT_DStream_t *local_2f0;
  BIT_DStream_status local_2e4;
  BIT_DStream_status local_2e0;
  uint local_2dc;
  BIT_DStream_t *local_2d8;
  BIT_DStream_status local_2cc;
  BIT_DStream_status local_2c8;
  uint local_2c4;
  BIT_DStream_t *local_2c0;
  BIT_DStream_status local_2b4;
  size_t local_2b0;
  U32 local_2a4;
  long local_2a0;
  BIT_DStream_t *local_298;
  undefined2 *local_290;
  uint local_284;
  BIT_DStream_t *local_280;
  size_t local_278;
  U32 local_26c;
  long local_268;
  BIT_DStream_t *local_260;
  undefined2 *local_258;
  uint local_24c;
  BIT_DStream_t *local_248;
  size_t local_240;
  U32 local_234;
  long local_230;
  BIT_DStream_t *local_228;
  undefined2 *local_220;
  uint local_214;
  BIT_DStream_t *local_210;
  size_t local_208;
  U32 local_1fc;
  long local_1f8;
  BIT_DStream_t *local_1f0;
  undefined2 *local_1e8;
  uint local_1dc;
  BIT_DStream_t *local_1d8;
  size_t local_1d0;
  U32 local_1c4;
  long local_1c0;
  BIT_DStream_t *local_1b8;
  undefined2 *local_1b0;
  uint local_1a4;
  BIT_DStream_t *local_1a0;
  size_t local_198;
  U32 local_18c;
  long local_188;
  BIT_DStream_t *local_180;
  undefined2 *local_178;
  uint local_16c;
  BIT_DStream_t *local_168;
  size_t local_160;
  U32 local_154;
  long local_150;
  BIT_DStream_t *local_148;
  undefined2 *local_140;
  uint local_134;
  BIT_DStream_t *local_130;
  size_t local_128;
  U32 local_11c;
  long local_118;
  BIT_DStream_t *local_110;
  undefined2 *local_108;
  uint local_fc;
  BIT_DStream_t *local_f8;
  size_t local_f0;
  U32 local_e4;
  long local_e0;
  BIT_DStream_t *local_d8;
  undefined2 *local_d0;
  uint local_c4;
  BIT_DStream_t *local_c0;
  size_t local_b8;
  U32 local_ac;
  long local_a8;
  BIT_DStream_t *local_a0;
  undefined2 *local_98;
  uint local_8c;
  BIT_DStream_t *local_88;
  size_t local_80;
  U32 local_74;
  long local_70;
  BIT_DStream_t *local_68;
  undefined2 *local_60;
  uint local_54;
  BIT_DStream_t *local_50;
  size_t local_48;
  U32 local_3c;
  long local_38;
  BIT_DStream_t *local_30;
  undefined2 *local_28;
  uint local_1c;
  BIT_DStream_t *local_18;
  uint local_c;
  BIT_DStream_t *local_8;
  
  local_380 = in_R8 + 4;
  local_388 = (HUF_DecompressFastArgs *)(in_RDX + 6);
  local_390 = (undefined2 *)((long)in_RDI + in_RSI);
  local_378 = in_R9;
  local_358 = in_RSI;
  local_350 = in_RDI;
  code = HUF_DecompressFastArgs_init
                   (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                    (size_t)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                    in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  sVar3 = code;
  uVar1 = ERR_isError(code);
  local_348 = code;
  if (uVar1 == 0) {
    if (sVar3 == 0) {
      local_348 = 0;
    }
    else {
      if (in_stack_fffffffffffffbd8 < local_3c0) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x928e,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      (*local_378)(&stack0xfffffffffffffbd8);
      if (in_stack_fffffffffffffbd8 < local_388) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9292,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (in_stack_fffffffffffffbe0 < local_388) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9293,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (in_stack_fffffffffffffbe8 < local_388) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9294,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_410 < local_388) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9295,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_390 < local_3f0) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9296,
                      "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar2 = local_358 + 3 >> 2;
      local_448 = local_350;
      for (local_44c = 0; local_44c < 4; local_44c = local_44c + 1) {
        if ((ulong)((long)local_390 - (long)local_448) < uVar2) {
          local_448 = local_390;
        }
        else {
          local_448 = (undefined2 *)(uVar2 + (long)local_448);
        }
        in_stack_fffffffffffffb80 =
             (HUF_DecompressFastArgs *)
             HUF_initRemainingDStream
                       (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                        in_stack_fffffffffffffb7c,(BYTE *)0x3a3d4a);
        uVar1 = ERR_isError((size_t)in_stack_fffffffffffffb80);
        if (uVar1 != 0) {
          return (size_t)in_stack_fffffffffffffb80;
        }
        local_318 = (undefined2 *)alStack_408[local_44c];
        local_320 = (BIT_DStream_t *)&stack0xfffffffffffffb88;
        local_328 = local_448;
        local_330 = local_380;
        local_334 = 0xb;
        local_340 = local_318;
        if ((ulong)((long)local_448 - (long)local_318) < 8) {
          local_2f0 = (BIT_DStream_t *)&stack0xfffffffffffffb88;
          if (local_470 < 0x41) {
            if (local_468 < local_458) {
              if (local_468 == local_460) {
                if (local_470 < 0x40) {
                  local_2e4 = BIT_DStream_endOfBuffer;
                }
                else {
                  local_2e4 = BIT_DStream_completed;
                }
              }
              else {
                local_2f4 = local_470 >> 3;
                uVar4 = (ulong)local_2f4;
                if (local_468 + -uVar4 < local_460) {
                  local_2f4 = (int)local_468 - (int)local_460;
                }
                local_2f8 = (BIT_DStream_status)(local_468 + -uVar4 < local_460);
                local_468 = local_468 + -(ulong)local_2f4;
                sVar3 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffb7c,
                                                      in_stack_fffffffffffffb78));
                local_2f0->bitContainer = sVar3;
                local_2e4 = local_2f8;
              }
            }
            else {
              local_2e4 = BIT_reloadDStreamFast
                                    ((BIT_DStream_t *)
                                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            }
          }
          else {
            local_2e4 = BIT_DStream_overflow;
          }
        }
        else {
          uVar1 = MEM_64bits();
          if (uVar1 == 0) {
            while( true ) {
              local_2d8 = local_320;
              if (local_320->bitsConsumed < 0x41) {
                if (local_320->ptr < local_320->limitPtr) {
                  if (local_320->ptr == local_320->start) {
                    if (local_320->bitsConsumed < 0x40) {
                      local_2cc = BIT_DStream_endOfBuffer;
                    }
                    else {
                      local_2cc = BIT_DStream_completed;
                    }
                  }
                  else {
                    local_2dc = local_320->bitsConsumed >> 3;
                    bVar5 = local_320->ptr + -(ulong)local_2dc < local_320->start;
                    if (bVar5) {
                      local_2dc = (int)local_320->ptr - (int)local_320->start;
                    }
                    local_2e0 = (BIT_DStream_status)bVar5;
                    local_320->ptr = local_320->ptr + -(ulong)local_2dc;
                    local_2d8->bitsConsumed = local_2d8->bitsConsumed + local_2dc * -8;
                    sVar3 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffb7c,
                                                          in_stack_fffffffffffffb78));
                    local_2d8->bitContainer = sVar3;
                    local_2cc = local_2e0;
                  }
                }
                else {
                  local_2cc = BIT_reloadDStreamFast
                                        ((BIT_DStream_t *)
                                         CONCAT44(in_stack_fffffffffffffb7c,
                                                  in_stack_fffffffffffffb78));
                }
              }
              else {
                local_2cc = BIT_DStream_overflow;
              }
              if (local_2cc != BIT_DStream_unfinished ||
                  (undefined2 *)((long)local_328 + -7) <= local_318) break;
              uVar1 = MEM_64bits();
              if (uVar1 != 0) {
                local_178 = local_318;
                local_180 = local_320;
                local_188 = local_330;
                local_18c = local_334;
                local_198 = BIT_lookBitsFast(local_320,local_334);
                *local_178 = *(undefined2 *)(local_188 + local_198 * 4);
                local_168 = local_180;
                local_16c = (uint)*(byte *)(local_188 + 2 + local_198 * 4);
                local_180->bitsConsumed = local_16c + local_180->bitsConsumed;
                local_318 = (undefined2 *)
                            ((long)local_318 + (ulong)*(byte *)(local_188 + 3 + local_198 * 4));
              }
              MEM_64bits();
              local_d0 = local_318;
              local_d8 = local_320;
              local_e0 = local_330;
              local_e4 = local_334;
              local_f0 = BIT_lookBitsFast(local_320,local_334);
              *local_d0 = *(undefined2 *)(local_e0 + local_f0 * 4);
              local_c0 = local_d8;
              local_c4 = (uint)*(byte *)(local_e0 + 2 + local_f0 * 4);
              local_d8->bitsConsumed = local_c4 + local_d8->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_e0 + 3 + local_f0 * 4));
              uVar1 = MEM_64bits();
              if (uVar1 != 0) {
                local_140 = local_318;
                local_148 = local_320;
                local_150 = local_330;
                local_154 = local_334;
                local_160 = BIT_lookBitsFast(local_320,local_334);
                *local_140 = *(undefined2 *)(local_150 + local_160 * 4);
                local_130 = local_148;
                local_134 = (uint)*(byte *)(local_150 + 2 + local_160 * 4);
                local_148->bitsConsumed = local_134 + local_148->bitsConsumed;
                local_318 = (undefined2 *)
                            ((long)local_318 + (ulong)*(byte *)(local_150 + 3 + local_160 * 4));
              }
              local_108 = local_318;
              local_110 = local_320;
              local_118 = local_330;
              local_11c = local_334;
              local_128 = BIT_lookBitsFast(local_320,local_334);
              *local_108 = *(undefined2 *)(local_118 + local_128 * 4);
              local_f8 = local_110;
              local_fc = (uint)*(byte *)(local_118 + 2 + local_128 * 4);
              local_110->bitsConsumed = local_fc + local_110->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_118 + 3 + local_128 * 4));
            }
          }
          else {
            while( true ) {
              local_2c0 = local_320;
              if (local_320->bitsConsumed < 0x41) {
                if (local_320->ptr < local_320->limitPtr) {
                  if (local_320->ptr == local_320->start) {
                    if (local_320->bitsConsumed < 0x40) {
                      local_2b4 = BIT_DStream_endOfBuffer;
                    }
                    else {
                      local_2b4 = BIT_DStream_completed;
                    }
                  }
                  else {
                    local_2c4 = local_320->bitsConsumed >> 3;
                    bVar5 = local_320->ptr + -(ulong)local_2c4 < local_320->start;
                    if (bVar5) {
                      local_2c4 = (int)local_320->ptr - (int)local_320->start;
                    }
                    local_2c8 = (BIT_DStream_status)bVar5;
                    local_320->ptr = local_320->ptr + -(ulong)local_2c4;
                    local_2c0->bitsConsumed = local_2c0->bitsConsumed + local_2c4 * -8;
                    sVar3 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffb7c,
                                                          in_stack_fffffffffffffb78));
                    local_2c0->bitContainer = sVar3;
                    local_2b4 = local_2c8;
                  }
                }
                else {
                  local_2b4 = BIT_reloadDStreamFast
                                        ((BIT_DStream_t *)
                                         CONCAT44(in_stack_fffffffffffffb7c,
                                                  in_stack_fffffffffffffb78));
                }
              }
              else {
                local_2b4 = BIT_DStream_overflow;
              }
              if (local_2b4 != BIT_DStream_unfinished ||
                  (undefined2 *)((long)local_328 + -9) <= local_318) break;
              local_1b0 = local_318;
              local_1b8 = local_320;
              local_1c0 = local_330;
              local_1c4 = local_334;
              local_1d0 = BIT_lookBitsFast(local_320,local_334);
              *local_1b0 = *(undefined2 *)(local_1c0 + local_1d0 * 4);
              local_1a0 = local_1b8;
              local_1a4 = (uint)*(byte *)(local_1c0 + 2 + local_1d0 * 4);
              local_1b8->bitsConsumed = local_1a4 + local_1b8->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_1c0 + 3 + local_1d0 * 4));
              local_1f0 = local_320;
              local_1f8 = local_330;
              local_1fc = local_334;
              local_1e8 = local_318;
              local_208 = BIT_lookBitsFast(local_320,local_334);
              *local_1e8 = *(undefined2 *)(local_1f8 + local_208 * 4);
              local_1d8 = local_1f0;
              local_1dc = (uint)*(byte *)(local_1f8 + 2 + local_208 * 4);
              local_1f0->bitsConsumed = local_1dc + local_1f0->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_1f8 + 3 + local_208 * 4));
              local_228 = local_320;
              local_230 = local_330;
              local_234 = local_334;
              local_220 = local_318;
              local_240 = BIT_lookBitsFast(local_320,local_334);
              *local_220 = *(undefined2 *)(local_230 + local_240 * 4);
              local_210 = local_228;
              local_214 = (uint)*(byte *)(local_230 + 2 + local_240 * 4);
              local_228->bitsConsumed = local_214 + local_228->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_230 + 3 + local_240 * 4));
              local_260 = local_320;
              local_268 = local_330;
              local_26c = local_334;
              local_258 = local_318;
              local_278 = BIT_lookBitsFast(local_320,local_334);
              *local_258 = *(undefined2 *)(local_268 + local_278 * 4);
              local_248 = local_260;
              local_24c = (uint)*(byte *)(local_268 + 2 + local_278 * 4);
              local_260->bitsConsumed = local_24c + local_260->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_268 + 3 + local_278 * 4));
              local_298 = local_320;
              local_2a0 = local_330;
              local_2a4 = local_334;
              local_290 = local_318;
              local_2b0 = BIT_lookBitsFast(local_320,local_334);
              *local_290 = *(undefined2 *)(local_2a0 + local_2b0 * 4);
              local_280 = local_298;
              local_284 = (uint)*(byte *)(local_2a0 + 2 + local_2b0 * 4);
              local_298->bitsConsumed = local_284 + local_298->bitsConsumed;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_2a0 + 3 + local_2b0 * 4));
            }
          }
        }
        if (1 < (ulong)((long)local_328 - (long)local_318)) {
          while( true ) {
            local_308 = local_320;
            if (local_320->bitsConsumed < 0x41) {
              if (local_320->ptr < local_320->limitPtr) {
                if (local_320->ptr == local_320->start) {
                  if (local_320->bitsConsumed < 0x40) {
                    local_2fc = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_2fc = BIT_DStream_completed;
                  }
                }
                else {
                  local_30c = local_320->bitsConsumed >> 3;
                  bVar5 = local_320->ptr + -(ulong)local_30c < local_320->start;
                  if (bVar5) {
                    local_30c = (int)local_320->ptr - (int)local_320->start;
                  }
                  local_310 = (BIT_DStream_status)bVar5;
                  local_320->ptr = local_320->ptr + -(ulong)local_30c;
                  local_308->bitsConsumed = local_308->bitsConsumed + local_30c * -8;
                  sVar3 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffb7c,
                                                        in_stack_fffffffffffffb78));
                  local_308->bitContainer = sVar3;
                  local_2fc = local_310;
                }
              }
              else {
                local_2fc = BIT_reloadDStreamFast
                                      ((BIT_DStream_t *)
                                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
                                      );
              }
            }
            else {
              local_2fc = BIT_DStream_overflow;
            }
            if (local_2fc != BIT_DStream_unfinished || local_328 + -1 < local_318) break;
            local_98 = local_318;
            local_a0 = local_320;
            local_a8 = local_330;
            local_ac = local_334;
            local_b8 = BIT_lookBitsFast(local_320,local_334);
            *local_98 = *(undefined2 *)(local_a8 + local_b8 * 4);
            local_88 = local_a0;
            local_8c = (uint)*(byte *)(local_a8 + 2 + local_b8 * 4);
            local_a0->bitsConsumed = local_8c + local_a0->bitsConsumed;
            local_318 = (undefined2 *)
                        ((long)local_318 + (ulong)*(byte *)(local_a8 + 3 + local_b8 * 4));
          }
          for (; local_318 <= local_328 + -1;
              local_318 = (undefined2 *)
                          ((long)local_318 + (ulong)*(byte *)(local_70 + 3 + local_80 * 4))) {
            local_60 = local_318;
            local_68 = local_320;
            local_70 = local_330;
            local_74 = local_334;
            local_80 = BIT_lookBitsFast(local_320,local_334);
            *local_60 = *(undefined2 *)(local_70 + local_80 * 4);
            local_50 = local_68;
            local_54 = (uint)*(byte *)(local_70 + 2 + local_80 * 4);
            local_68->bitsConsumed = local_54 + local_68->bitsConsumed;
          }
        }
        if (local_318 < local_328) {
          local_28 = local_318;
          local_30 = local_320;
          local_38 = local_330;
          local_3c = local_334;
          local_48 = BIT_lookBitsFast(local_320,local_334);
          *(undefined1 *)local_28 = *(undefined1 *)(local_38 + local_48 * 4);
          if (*(char *)(local_38 + 3 + local_48 * 4) == '\x01') {
            local_8 = local_30;
            local_c = (uint)*(byte *)(local_38 + 2 + local_48 * 4);
            local_30->bitsConsumed = local_c + local_30->bitsConsumed;
          }
          else if (local_30->bitsConsumed < 0x40) {
            local_18 = local_30;
            local_1c = (uint)*(byte *)(local_38 + 2 + local_48 * 4);
            local_30->bitsConsumed = local_1c + local_30->bitsConsumed;
            if (0x40 < local_30->bitsConsumed) {
              local_30->bitsConsumed = 0x40;
            }
          }
          local_318 = (undefined2 *)((long)local_318 + 1);
        }
        alStack_408[local_44c] =
             (long)((long)local_318 + (alStack_408[local_44c] - (long)local_340));
        if ((undefined2 *)alStack_408[local_44c] != local_448) {
          return 0xffffffffffffffec;
        }
      }
      local_348 = local_358;
    }
  }
  return local_348;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}